

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O2

int ssl_ticket_gen_key(mbedtls_ssl_ticket_context *ctx,uchar index)

{
  mbedtls_ssl_ticket_key *pmVar1;
  mbedtls_cipher_info_t *pmVar2;
  int iVar3;
  ulong uVar4;
  time_t tVar5;
  uint key_bitlen;
  undefined7 in_register_00000031;
  uchar buf [32];
  
  uVar4 = CONCAT71(in_register_00000031,index) & 0xffffffff;
  pmVar1 = ctx->keys + uVar4;
  tVar5 = time((time_t *)0x0);
  ctx->keys[uVar4].generation_time = (uint32_t)tVar5;
  iVar3 = (*ctx->f_rng)(ctx->p_rng,pmVar1->name,4);
  if ((iVar3 == 0) && (iVar3 = (*ctx->f_rng)(ctx->p_rng,buf,0x20), iVar3 == 0)) {
    pmVar2 = (pmVar1->ctx).cipher_info;
    if (pmVar2 == (mbedtls_cipher_info_t *)0x0) {
      key_bitlen = 0;
    }
    else {
      key_bitlen = pmVar2->key_bitlen;
    }
    iVar3 = mbedtls_cipher_setkey(&pmVar1->ctx,buf,key_bitlen,MBEDTLS_ENCRYPT);
    mbedtls_zeroize(buf,0x20);
  }
  return iVar3;
}

Assistant:

static int ssl_ticket_gen_key( mbedtls_ssl_ticket_context *ctx,
                               unsigned char index )
{
    int ret;
    unsigned char buf[MAX_KEY_BYTES];
    mbedtls_ssl_ticket_key *key = ctx->keys + index;

#if defined(MBEDTLS_HAVE_TIME)
    key->generation_time = (uint32_t) mbedtls_time( NULL );
#endif

    if( ( ret = ctx->f_rng( ctx->p_rng, key->name, sizeof( key->name ) ) ) != 0 )
        return( ret );

    if( ( ret = ctx->f_rng( ctx->p_rng, buf, sizeof( buf ) ) ) != 0 )
        return( ret );

    /* With GCM and CCM, same context can encrypt & decrypt */
    ret = mbedtls_cipher_setkey( &key->ctx, buf,
                                 mbedtls_cipher_get_key_bitlen( &key->ctx ),
                                 MBEDTLS_ENCRYPT );

    mbedtls_zeroize( buf, sizeof( buf ) );

    return( ret );
}